

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::eval(value *__return_storage_ptr__,interpreter *this,statement *s)

{
  _Head_base<0UL,_mjs::interpreter::impl_*,_false> _Var1;
  wostream *os;
  native_error_exception *this_00;
  global_object *this_01;
  completion c;
  wostringstream woss;
  gc_heap_ptr_untyped local_250;
  wstring_view local_240;
  wchar_t *local_230;
  size_t local_228;
  wstring local_210;
  undefined1 local_1f0 [64];
  wstring_view local_1b0;
  wostringstream local_1a0 [376];
  
  impl::hoist((this->impl_)._M_t.
              super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
              .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl,s);
  impl::eval((completion *)local_1f0,
             (this->impl_)._M_t.
             super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
             .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl,s);
  if (local_1f0._0_4_ == normal) {
    value::value(__return_storage_ptr__,(value *)(local_1f0 + 8));
    value::destroy((value *)(local_1f0 + 8));
    return __return_storage_ptr__;
  }
  if (local_1f0._0_4_ == throw_) {
    if (local_1f0._8_4_ == object) {
      rethrow_error((object_ptr *)(local_1f0 + 0x10));
    }
    __assert_fail("type_ == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                  0x46,"const object_ptr &mjs::value::object_value() const");
  }
  std::__cxx11::wostringstream::wostringstream(local_1a0);
  os = std::operator<<((wostream *)local_1a0,"Eval resulted in unexpected completion type ");
  mjs::operator<<(os,(completion *)local_1f0);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>.
       _M_t.
       super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>
       .super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl;
  local_250.heap_ = ((_Var1._M_head_impl)->global_).super_gc_heap_ptr_untyped.heap_;
  local_250.pos_ = *(uint32_t *)((long)&(_Var1._M_head_impl)->global_ + 8);
  if (local_250.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_250.heap_,&local_250);
  }
  this_01 = (global_object *)gc_heap_ptr_untyped::get(&local_250);
  global_object::stack_trace_abi_cxx11_(&local_210,this_01);
  local_240._M_len = local_210._M_string_length;
  local_240._M_str = local_210._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b0._M_len = local_228;
  local_1b0._M_str = local_230;
  native_error_exception::native_error_exception(this_00,eval,&local_240,&local_1b0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value interpreter::eval(const statement& s) {
    impl_->hoist(s);
    auto c = impl_->eval(s);
    if (!c) {
        return c.result;
    } else if (c.type == completion_type::throw_) {
        rethrow_error(c.result.object_value());
    }
    std::wostringstream woss;
    woss << "Eval resulted in unexpected completion type " << c;
    throw native_error_exception{native_error_type::eval, impl_->global()->stack_trace(), woss.str()};
}